

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolynomialEvaluation.cpp
# Opt level: O0

Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *
Inferences::simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>>
          (Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in,PolyNf *simplifiedArgs,
          bool removeZeros)

{
  IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_PolynomialEvaluation_cpp:364:18),_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  it;
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  MonomFactor *pMVar5;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *this;
  Monom *pMVar6;
  ulong uVar7;
  size_t sVar8;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *pMVar9;
  byte in_CL;
  __off_t __length;
  long in_RSI;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_RDI;
  int power_1;
  PolyNf term;
  Numeral num2;
  Option<Kernel::RealConstantType> c;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *arg;
  uint i_1;
  bool needsSorting;
  int offs;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *poly;
  Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
  poly_;
  int power;
  uint i;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> args;
  Numeral numeral;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *facs;
  anon_class_1_0_00000001 pow;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_fffffffffffffc58;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_fffffffffffffc60;
  RationalConstantType *in_stack_fffffffffffffc68;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
  *in_stack_fffffffffffffc70;
  Numeral *in_stack_fffffffffffffc78;
  undefined5 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc85;
  byte bVar10;
  undefined1 in_stack_fffffffffffffc86;
  byte bVar11;
  undefined1 in_stack_fffffffffffffc87;
  undefined8 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_fffffffffffffca0;
  undefined7 in_stack_fffffffffffffca8;
  undefined1 in_stack_fffffffffffffcaf;
  unsigned_long in_stack_fffffffffffffcb0;
  bool local_339;
  IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1775:65),_const_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_&>_>
  *in_stack_fffffffffffffcd8;
  anon_class_8_1_a8787825_for__func in_stack_fffffffffffffce0;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *this_00;
  int local_224;
  OptionBase<Kernel::RealConstantType> local_1a8;
  MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *local_180;
  uint local_174;
  byte local_16d;
  int local_16c;
  int local_134;
  int *local_130;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *local_108;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *pSStack_100;
  RationalConstantType *local_f8;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *pSStack_f0;
  Numeral *local_e8;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *local_a0;
  int local_7c;
  uint local_78;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> local_68 [2];
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *local_28;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_28 = Lib::
             Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
             ::operator*((Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                          *)(in_RSI + 0x20));
  Kernel::RealConstantType::RealConstantType
            ((RealConstantType *)in_stack_fffffffffffffc60,
             (RealConstantType *)in_stack_fffffffffffffc58);
  Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::nFactors
            ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81ff48);
  Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Stack
            (in_stack_fffffffffffffc70,(size_t)in_stack_fffffffffffffc68);
  local_78 = 0;
  do {
    uVar4 = local_78;
    uVar3 = Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::nFactors
                      ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x81ff91);
    if (uVar3 <= uVar4) {
      this_00 = local_68;
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::begin(this_00)
      ;
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::end(this_00);
      std::sort<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>*>
                ((MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 in_stack_fffffffffffffc70,
                 (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 in_stack_fffffffffffffc68);
      local_16c = 0;
      local_16d = 0;
      local_174 = 0;
      while( true ) {
        uVar7 = (ulong)local_174;
        sVar8 = Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::size
                          (local_68);
        if (sVar8 <= uVar7) break;
        local_180 = Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
                    operator[](local_68,(ulong)local_174);
        Kernel::PolyNf::tryNumeral<Kernel::NumTraits<Kernel::RealConstantType>>
                  ((PolyNf *)in_stack_fffffffffffffc68);
        bVar1 = Lib::OptionBase<Kernel::RealConstantType>::isSome(&local_1a8);
        if (bVar1) {
          Lib::OptionBase<Kernel::RealConstantType>::unwrap
                    ((OptionBase<Kernel::RealConstantType> *)0x8203d6);
          Kernel::RealConstantType::RealConstantType
                    ((RealConstantType *)in_stack_fffffffffffffc60,
                     (RealConstantType *)in_stack_fffffffffffffc58);
          simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>_>::anon_class_1_0_00000001::
          operator()((anon_class_1_0_00000001 *)
                     CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                     (Numeral *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
          Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x820428);
          Kernel::RealConstantType::operator*
                    ((RealConstantType *)
                     CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                     (RealConstantType *)in_stack_fffffffffffffca0);
          Kernel::RealConstantType::operator=
                    ((RealConstantType *)in_stack_fffffffffffffc60,
                     (RealConstantType *)in_stack_fffffffffffffc58);
          Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x82046b);
          Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x820478);
        }
        else {
          Kernel::PolyNf::PolyNf
                    ((PolyNf *)in_stack_fffffffffffffc60,(PolyNf *)in_stack_fffffffffffffc58);
          local_224 = local_180->power;
          while( true ) {
            uVar4 = local_174 + 1;
            sVar8 = Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
                    size(local_68);
            local_339 = false;
            if (uVar4 < sVar8) {
              Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
              operator[](local_68,(ulong)(local_174 + 1));
              in_stack_fffffffffffffcaf =
                   Kernel::operator==((PolyNf *)in_stack_fffffffffffffc60,
                                      (PolyNf *)in_stack_fffffffffffffc58);
              local_339 = (bool)in_stack_fffffffffffffcaf;
            }
            if (local_339 == false) break;
            in_stack_fffffffffffffca0 =
                 Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
                 operator[](local_68,(ulong)(local_174 + 1));
            local_224 = in_stack_fffffffffffffca0->power + local_224;
            local_174 = local_174 + 1;
          }
          if (local_224 != 0) {
            Kernel::PolyNf::PolyNf
                      ((PolyNf *)in_stack_fffffffffffffc60,(PolyNf *)in_stack_fffffffffffffc58);
            Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactor
                      ((MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                       in_stack_fffffffffffffc70,(PolyNf *)in_stack_fffffffffffffc68,
                       (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
            sVar8 = (size_t)local_16c;
            local_16c = local_16c + 1;
            pMVar9 = Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                     ::operator[](local_68,sVar8);
            in_stack_fffffffffffffc98 = SUB84(pMVar9,0);
            in_stack_fffffffffffffc9c = (int)((ulong)pMVar9 >> 0x20);
            Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>::operator=
                      ((MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                       in_stack_fffffffffffffc60,
                       (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                       in_stack_fffffffffffffc58);
          }
        }
        Lib::Option<Kernel::RealConstantType>::~Option((Option<Kernel::RealConstantType> *)0x820680)
        ;
        local_174 = local_174 + 1;
      }
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::truncate
                (local_68,(char *)(long)local_16c,__length);
      if ((local_16d & 1) != 0) {
        Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::begin
                  (local_68);
        Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::end
                  (local_68);
        std::sort<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>*>
                  ((MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                   in_stack_fffffffffffffc70,
                   (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                   in_stack_fffffffffffffc68);
      }
      Kernel::RealConstantType::RealConstantType
                ((RealConstantType *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      uVar2 = Kernel::RationalConstantType::operator==
                        ((RationalConstantType *)in_stack_fffffffffffffc70,in_stack_fffffffffffffc68
                        );
      bVar10 = local_19;
      if (!(bool)uVar2) {
        bVar10 = 0;
      }
      bVar11 = bVar10;
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x820758);
      if ((bVar10 & 1) == 0) {
        Kernel::RealConstantType::RealConstantType
                  ((RealConstantType *)in_stack_fffffffffffffc60,
                   (RealConstantType *)in_stack_fffffffffffffc58);
        Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactors
                  ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                   in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
        Lib::
        perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
                  ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                   CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
                  ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                   CONCAT17(uVar2,CONCAT16(bVar11,CONCAT15(bVar10,in_stack_fffffffffffffc80))),
                   in_stack_fffffffffffffc78,
                   (Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                    *)in_stack_fffffffffffffc70);
        Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::~MonomFactors
                  ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x820818);
        Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x820825);
      }
      else {
        Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::zero();
      }
      local_134 = 1;
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::~Stack
                (in_stack_fffffffffffffc60);
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x820892);
      return in_RDI;
    }
    pMVar5 = Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::factorAt
                       ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                        in_stack_fffffffffffffc60,(uint)((ulong)in_stack_fffffffffffffc58 >> 0x20));
    local_7c = pMVar5->power;
    Kernel::PolyNf::downcast<Kernel::NumTraits<Kernel::RealConstantType>>
              ((PolyNf *)in_stack_fffffffffffffc78);
    bVar1 = Lib::Option::operator_cast_to_bool
                      ((Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                        *)0x820013);
    if (bVar1) {
      this = Lib::
             Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
             ::operator*((Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                          *)0x820039);
      local_a0 = Lib::
                 Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
                 ::operator*(this);
      uVar4 = Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::nSummands
                        ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x820065);
      if (uVar4 != 1) goto LAB_0082023c;
      Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::summandAt
                ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)in_stack_fffffffffffffc60,
                 (uint)((ulong)in_stack_fffffffffffffc58 >> 0x20));
      Kernel::RealConstantType::RealConstantType
                ((RealConstantType *)in_stack_fffffffffffffc60,
                 (RealConstantType *)in_stack_fffffffffffffc58);
      simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>_>::anon_class_1_0_00000001::
      operator()((anon_class_1_0_00000001 *)
                 CONCAT17(in_stack_fffffffffffffcaf,in_stack_fffffffffffffca8),
                 (Numeral *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      Kernel::RationalConstantType::operator*=
                ((RationalConstantType *)in_stack_fffffffffffffc60,
                 (RationalConstantType *)in_stack_fffffffffffffc58);
      uVar4 = (uint)((ulong)in_stack_fffffffffffffc58 >> 0x20);
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x8200e9);
      Kernel::RealConstantType::~RealConstantType((RealConstantType *)0x8200f6);
      pMVar6 = Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::summandAt
                         ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                          in_stack_fffffffffffffc60,uVar4);
      Lib::
      Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
      ::operator->(&pMVar6->factors);
      Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::iter
                ((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 in_stack_fffffffffffffc60);
      local_130 = &local_7c;
      Lib::
      IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::{lambda(auto:1)#1},Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>>
      ::
      map<Inferences::simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::PolyNf*,bool)::_lambda(auto:1)_1_>
                (in_stack_fffffffffffffcd8,in_stack_fffffffffffffce0);
      it._iter._inner._func.a._0_4_ = in_stack_fffffffffffffc98;
      it._iter._func.power = (int *)in_stack_fffffffffffffc90;
      it._iter._inner._func.a._4_4_ = in_stack_fffffffffffffc9c;
      it._iter._inner._inner._next = (unsigned_long)in_stack_fffffffffffffca0;
      it._iter._inner._inner._from._0_7_ = in_stack_fffffffffffffca8;
      it._iter._inner._inner._from._7_1_ = in_stack_fffffffffffffcaf;
      it._iter._inner._inner._to = in_stack_fffffffffffffcb0;
      in_stack_fffffffffffffc58 = local_108;
      in_stack_fffffffffffffc60 = pSStack_100;
      in_stack_fffffffffffffc68 = local_f8;
      in_stack_fffffffffffffc70 = pSStack_f0;
      in_stack_fffffffffffffc78 = local_e8;
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>::
      loadFromIterator<Lib::IterTraits<Lib::MappingIterator<Lib::MappingIterator<Lib::RangeIterator<unsigned_long>,Lib::arrayIter<Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>,unsigned_long>(Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>const&,unsigned_long)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>const&>,Inferences::simplifyMonom<Kernel::NumTraits<Kernel::RealConstantType>>(Kernel::Monom<Kernel::NumTraits<Kernel::RealConstantType>>const&,Kernel::PolyNf*,bool)::_lambda(auto:1)_1_,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>
                ((Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,
                          CONCAT16(in_stack_fffffffffffffc86,
                                   CONCAT15(in_stack_fffffffffffffc85,in_stack_fffffffffffffc80))),
                 it);
      local_134 = 4;
    }
    else {
LAB_0082023c:
      local_134 = 0;
    }
    Lib::
    Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
    ::~Option((Option<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
               *)0x820254);
    if (local_134 == 0) {
      Kernel::PolyNf::PolyNf
                ((PolyNf *)in_stack_fffffffffffffc60,(PolyNf *)in_stack_fffffffffffffc58);
      Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>::MonomFactor
                ((MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 in_stack_fffffffffffffc70,(PolyNf *)in_stack_fffffffffffffc68,
                 (int)((ulong)in_stack_fffffffffffffc60 >> 0x20));
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>::push
                (in_stack_fffffffffffffc70,
                 (MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_> *)
                 in_stack_fffffffffffffc68);
    }
    local_78 = local_78 + 1;
  } while( true );
}

Assistant:

Monom<Number> simplifyMonom(Monom<Number> const& in, PolyNf* simplifiedArgs, bool removeZeros)
{ 

  using Numeral      = typename Number::ConstantType;
  using Monom        = Monom<Number>;
  using MonomFactor  = MonomFactor<Number>;
  using MonomFactors = MonomFactors<Number>;

  auto pow = [](Numeral c, int power) -> Numeral {
    ASS(power > 0)
    auto out = c;
    while (--power > 0) {
      out = out * c;
    }
    return out;
  };

  
  auto& facs = *in.factors;
  auto numeral = in.numeral;
  Stack<MonomFactor> args(facs.nFactors());
  for (unsigned i = 0; i < facs.nFactors(); i++) {
    auto power = facs.factorAt(i).power;
    if (auto poly_ = simplifiedArgs[i].downcast<Number>()) {
      auto& poly = **poly_;
      if (poly.nSummands() == 1) {
        numeral *= pow(poly.summandAt(0).numeral, power);
        args.loadFromIterator(
            poly.summandAt(0).factors->iter()
            .map([&](auto fac) { fac.power *= power; return fac; }));
        continue;
      }
    }
    args.push(MonomFactor(simplifiedArgs[i], power));
  }

  std::sort(args.begin(), args.end());

  auto offs = 0;
  bool needsSorting = false;

  for (unsigned i = 0; i < args.size(); i++) {
    auto& arg = args[i];
    auto c = arg.term.template tryNumeral<Number>();
    if (c.isSome()) {
      // arg is a number constant
      auto num2 = pow(c.unwrap(), arg.power);
      numeral = numeral * num2;
    } else {
      // arg is a non-number term
      auto term  = arg.term;
      auto power = arg.power;
      while (i + 1 < args.size() && args[i + 1].term == term) {
        power += args[i + 1].power;
        i++;
      }
      if (power != 0) {
        args[offs++] = MonomFactor(term, power);
      }
    }
  }
  args.truncate(offs);

  if (needsSorting) {
    std::sort(args.begin(), args.end());
  }

  if (numeral == Numeral(0) && removeZeros) {
    return Monom::zero();
  } else {
    return Monom(numeral, perfect(MonomFactors(std::move(args))));
  }
}